

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O3

void __thiscall
t_java_generator::generate_union_hashcode(t_java_generator *this,ostream *out,t_struct *tstruct)

{
  ostream *poVar1;
  
  poVar1 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"@Override",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar1 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"public int hashCode() {",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar1 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "  java.util.List<java.lang.Object> list = new java.util.ArrayList<java.lang.Object>();"
             ,0x56);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar1 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  list.add(this.getClass().getName());",0x26);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar1 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  org.apache.thrift.TFieldIdEnum setField = getSetField();",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar1 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  if (setField != null) {",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar1 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"    list.add(setField.getThriftFieldId());",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar1 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"    java.lang.Object value = getFieldValue();",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar1 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"    if (value instanceof org.apache.thrift.TEnum) {",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar1 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"      list.add(((org.apache.thrift.TEnum)getFieldValue()).getValue());",0x46);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar1 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    } else {",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar1 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"      list.add(value);",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar1 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    }",5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar1 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  }",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar1 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  return list.hashCode();",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar1 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}",1);
  return;
}

Assistant:

void t_java_generator::generate_union_hashcode(ostream& out, t_struct* tstruct) {
  (void)tstruct;
  indent(out) << "@Override" << endl;
  indent(out) << "public int hashCode() {" << endl;
  indent(out) << "  java.util.List<java.lang.Object> list = new java.util.ArrayList<java.lang.Object>();" << endl;
  indent(out) << "  list.add(this.getClass().getName());" << endl;
  indent(out) << "  org.apache.thrift.TFieldIdEnum setField = getSetField();" << endl;
  indent(out) << "  if (setField != null) {" << endl;
  indent(out) << "    list.add(setField.getThriftFieldId());" << endl;
  indent(out) << "    java.lang.Object value = getFieldValue();" << endl;
  indent(out) << "    if (value instanceof org.apache.thrift.TEnum) {" << endl;
  indent(out) << "      list.add(((org.apache.thrift.TEnum)getFieldValue()).getValue());" << endl;
  indent(out) << "    } else {" << endl;
  indent(out) << "      list.add(value);" << endl;
  indent(out) << "    }" << endl;
  indent(out) << "  }" << endl;
  indent(out) << "  return list.hashCode();" << endl;
  indent(out) << "}";
}